

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O3

void __thiscall
checker_texture::checker_texture
          (checker_texture *this,shared_ptr<texture> *t0,shared_ptr<texture> *t1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_texture)._vptr_texture = (_func_int **)&PTR_value_0012e710;
  (this->odd).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t0->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (t0->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->odd).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->even).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t1->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (t1->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->even).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

checker_texture(shared_ptr<texture> t0, shared_ptr<texture> t1) : odd(t0), even(t1) {}